

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

ptrdiff_t Imf_2_5::anon_unknown_1::cachePadding(ptrdiff_t size)

{
  int iVar1;
  byte bVar2;
  int i;
  
  i._0_1_ = 10;
  do {
    bVar2 = (byte)i;
    i._0_1_ = bVar2 + 1;
  } while (1 < size >> (bVar2 & 0x3f));
  iVar1 = 2 << (bVar2 & 0x1f);
  if ((size <= iVar1 + -0x40) && (iVar1 = 1 << (bVar2 & 0x1f), iVar1 + 0x40 <= size)) {
    return 0;
  }
  return (iVar1 - size) + 0x40;
}

Assistant:

ptrdiff_t
cachePadding (ptrdiff_t size)
{
    //
    // Some of the buffers that are allocated by classes ToYca and
    // FromYca, below, may need to be padded to avoid cache thrashing.
    // If the difference between the buffer size and the nearest power
    // of two is less than CACHE_LINE_SIZE, then we add an appropriate
    // amount of padding.
    //
    // CACHE_LINE_SIZE must be a power of two, and it must be at
    // least as big as the true size of a cache line on the machine
    // we are running on.  (It is ok if CACHE_LINE_SIZE is larger
    // than a real cache line.)
    //
    // CACHE_LINE_SIZE = (1 << LOG2_CACHE_LINE_SIZE)
    //

    static int LOG2_CACHE_LINE_SIZE = 8;

    int i = LOG2_CACHE_LINE_SIZE + 2;

    while ((size >> i) > 1)
	++i;

    if (size > (1 << (i + 1)) - 64)
	return 64 + ((1 << (i + 1)) - size);

    if (size < (1 << i) + 64)
	return 64 + ((1 << i) - size);

    return 0;
}